

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_string.c
# Opt level: O0

void cmime_string_list_free(CMimeStringList_T *sl)

{
  ulong local_18;
  size_t i;
  CMimeStringList_T *sl_local;
  
  if (sl != (CMimeStringList_T *)0x0) {
    for (local_18 = 0; local_18 < sl->count; local_18 = local_18 + 1) {
      if (sl->node[local_18] != (char *)0x0) {
        free(sl->node[local_18]);
      }
    }
    free(sl->node);
    sl->node = (char **)0x0;
    free(sl);
    return;
  }
  __assert_fail("sl",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_string.c"
                ,0x29,"void cmime_string_list_free(CMimeStringList_T *)");
}

Assistant:

void cmime_string_list_free(CMimeStringList_T *sl) {
    size_t i;
    assert(sl);

    for(i = 0; i < sl->count; i++) {
        if (sl->node[i]!=NULL)
            free(sl->node[i]);
    } 
    free(sl->node);
    sl->node = NULL;
    free(sl); 
}